

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O3

void I_InitGraphics(void)

{
  int iVar1;
  undefined8 uVar2;
  SDLVideo *this;
  UCVarValue value;
  
  iVar1 = SDL_InitSubSystem(0x20);
  if (-1 < iVar1) {
    uVar2 = SDL_GetCurrentVideoDriver();
    Printf("Using video driver %s\n",uVar2);
    iVar1 = DArgs::CheckParm(Args,"-devparm",1);
    value._1_7_ = 0;
    value.Bool = iVar1 != 0;
    FBoolCVar::SetGenericRepDefault(&ticker,value,CVAR_Bool);
    this = (SDLVideo *)operator_new(0x10);
    SDLVideo::SDLVideo(this,0);
    Video = (IVideo *)this;
    addterm(I_ShutdownGraphics,"I_ShutdownGraphics");
    (*Video->_vptr_IVideo[3])(vid_winscale.Value);
    return;
  }
  uVar2 = SDL_GetError();
  I_FatalError("Could not initialize SDL video:\n%s\n",uVar2);
  return;
}

Assistant:

void I_InitGraphics ()
{
	if (SDL_InitSubSystem (SDL_INIT_VIDEO) < 0)
	{
		I_FatalError ("Could not initialize SDL video:\n%s\n", SDL_GetError());
		return;
	}

	Printf("Using video driver %s\n", SDL_GetCurrentVideoDriver());

	UCVarValue val;

	val.Bool = !!Args->CheckParm ("-devparm");
	ticker.SetGenericRepDefault (val, CVAR_Bool);

	Video = new SDLVideo (0);
	if (Video == NULL)
		I_FatalError ("Failed to initialize display");

	atterm (I_ShutdownGraphics);

	Video->SetWindowedScale (vid_winscale);
}